

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_node_choice(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  byte *pbVar1;
  lysp_node *name;
  LY_ERR LVar2;
  char *pcVar3;
  lys_module *module;
  long *plVar4;
  lysc_node *plVar5;
  long lVar6;
  lysp_node *plVar7;
  
  if (node->nodetype != 2) {
    __assert_fail("node->nodetype == LYS_CHOICE",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xe7e,
                  "LY_ERR lys_compile_node_choice(struct lysc_ctx *, struct lysp_node *, struct lysc_node *)"
                 );
  }
  for (plVar7 = pnode[1].parent; plVar7 != (lysp_node *)0x0; plVar7 = plVar7->next) {
    LVar2 = lys_compile_node_choice_child(ctx,plVar7,node,(ly_set *)0x0);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  LVar2 = lys_compile_node_augments(ctx,node);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  plVar7 = pnode[1].next;
  if (plVar7 == (lysp_node *)0x0) {
LAB_0014c769:
    LVar2 = LY_SUCCESS;
  }
  else {
    pcVar3 = strchr((char *)plVar7,0x3a);
    if (pcVar3 == (char *)0x0) {
      module = node->module;
      name = plVar7;
LAB_0014c721:
      plVar5 = lys_find_child(node,module,(char *)name,0,0x80,4);
      node[1].parent = plVar5;
      if (plVar5 == (lysc_node *)0x0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Default case \"%s\" not found.",pnode[1].next);
      }
      else {
        lVar6._0_2_ = plVar5[1].nodetype;
        lVar6._2_2_ = plVar5[1].flags;
        lVar6._4_1_ = plVar5[1].hash[0];
        lVar6._5_1_ = plVar5[1].hash[1];
        lVar6._6_1_ = plVar5[1].hash[2];
        lVar6._7_1_ = plVar5[1].hash[3];
        for (; (lVar6 != 0 && (*(lysc_node **)(lVar6 + 0x10) == plVar5));
            lVar6 = *(long *)(lVar6 + 0x18)) {
          if ((*(byte *)(lVar6 + 2) & 0x20) != 0) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                    "Mandatory node \"%s\" under the default case \"%s\".",
                    *(undefined8 *)(lVar6 + 0x28),pnode[1].next);
            goto LAB_0014c7f0;
          }
        }
        if ((node->flags & 0x20) == 0) {
          pbVar1 = (byte *)((long)&plVar5->flags + 1);
          *pbVar1 = *pbVar1 | 2;
          goto LAB_0014c769;
        }
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid mandatory choice with a default case.")
        ;
      }
    }
    else {
      module = ly_resolve_prefix(ctx->ctx,plVar7,(long)pcVar3 - (long)plVar7,LY_VALUE_SCHEMA,
                                 pnode[1].name);
      name = (lysp_node *)(pcVar3 + 1);
      if (module != (lys_module *)0x0) goto LAB_0014c721;
      plVar4 = (long *)pnode[1].name;
      if ((*(byte *)((long)plVar4 + 0x79) & 2) == 0) {
        plVar4 = (long *)(*plVar4 + 8);
      }
      else {
        plVar4 = plVar4 + 0x10;
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Default case prefix \"%.*s\" not found in imports of \"%s\".",
              (long)pcVar3 - (long)plVar7 & 0xffffffff,plVar7,*plVar4);
    }
LAB_0014c7f0:
    LVar2 = LY_EVALID;
  }
  return LVar2;
}

Assistant:

static LY_ERR
lys_compile_node_choice(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_choice *ch_p = (struct lysp_node_choice *)pnode;
    struct lysc_node_choice *ch = (struct lysc_node_choice *)node;
    struct lysp_node *child_p;
    LY_ERR ret = LY_SUCCESS;

    assert(node->nodetype == LYS_CHOICE);

    LY_LIST_FOR(ch_p->child, child_p) {
        LY_CHECK_GOTO(ret = lys_compile_node_choice_child(ctx, child_p, node, NULL), done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    /* default branch */
    if (ch_p->dflt.str) {
        LY_CHECK_GOTO(ret = lys_compile_node_choice_dflt(ctx, &ch_p->dflt, ch), done);
    }

done:
    return ret;
}